

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManCreateSat(Of_Man_t *p,int nCutsAll,Vec_Int_t *vFirst,Vec_Int_t *vCutNum,
                    Vec_Int_t *vBestNode,Vec_Int_t *vBestCut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  abctime aVar5;
  sat_solver *s;
  int *piVar6;
  int *end;
  Gia_Obj_t *pGVar7;
  abctime aVar8;
  bool bVar9;
  uint local_ac;
  int nOnes;
  int nCuts;
  int iFirst;
  sat_solver *pSat;
  abctime clk;
  Vec_Int_t *vLits;
  int nClauses;
  int nCutCount;
  int RetValue;
  int status;
  int pLits [2];
  int Lit;
  int Var;
  int c;
  int v;
  int k;
  int i;
  int *pCut;
  int *pCutSet;
  Gia_Obj_t *pVar;
  Gia_Obj_t *pObj;
  Vec_Int_t *vBestCut_local;
  Vec_Int_t *vBestNode_local;
  Vec_Int_t *vCutNum_local;
  Vec_Int_t *vFirst_local;
  int nCutsAll_local;
  Of_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  aVar5 = Abc_Clock();
  s = sat_solver_new();
  iVar1 = Gia_ManAndNum(p->pGia);
  sat_solver_setnvars(s,iVar1 + nCutsAll);
  Vec_IntAppend(vBestNode,vBestCut);
  piVar6 = Vec_IntArray(vBestNode);
  iVar1 = Vec_IntSize(vBestNode);
  sat_solver_set_polarity(s,piVar6,iVar1);
  iVar1 = Vec_IntSize(vBestNode);
  iVar2 = Vec_IntSize(vBestCut);
  Vec_IntShrink(vBestNode,iVar1 - iVar2);
  v = 0;
  do {
    bVar9 = false;
    if (v < p->pGia->nObjs) {
      pVar = Gia_ManObj(p->pGia,v);
      bVar9 = pVar != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) {
      vLits._4_4_ = 0;
      v = 0;
      while( true ) {
        bVar9 = false;
        if (v < p->pGia->nObjs) {
          pVar = Gia_ManObj(p->pGia,v);
          bVar9 = pVar != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        iVar1 = Gia_ObjIsAnd(pVar);
        if (iVar1 != 0) {
          piVar6 = Of_ObjCutSet(p,v);
          c = 0;
          _k = piVar6 + 1;
          while (c < *piVar6) {
            iVar1 = Gia_ManAndNum(p->pGia);
            RetValue = Abc_Var2Lit(iVar1 + vLits._4_4_,1);
            status = Abc_Var2Lit(pVar->Value,0);
            iVar1 = sat_solver_addclause(s,&RetValue,pLits);
            if (iVar1 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x613,
                            "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            Var = 0;
            while( true ) {
              iVar1 = Of_CutSize(_k);
              bVar9 = false;
              if (Var < iVar1) {
                pLits[1] = Of_CutVar(_k,Var);
                bVar9 = pLits[1] != 0;
              }
              if (!bVar9) break;
              pGVar7 = Gia_ManObj(p->pGia,pLits[1]);
              iVar1 = Gia_ObjIsAnd(pGVar7);
              if (iVar1 != 0) {
                status = Abc_Var2Lit(pGVar7->Value,0);
                iVar1 = sat_solver_addclause(s,&RetValue,pLits);
                if (iVar1 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                                ,0x61b,
                                "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                               );
                }
              }
              Var = Var + 1;
            }
            vLits._4_4_ = vLits._4_4_ + 1;
            c = c + 1;
            iVar1 = Of_CutSize(_k);
            _k = _k + (iVar1 + 4);
          }
        }
        v = v + 1;
      }
      if (vLits._4_4_ != nCutsAll) {
        __assert_fail("nCutCount == nCutsAll",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                      ,0x620,
                      "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      v = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->pGia->vCos);
        bVar9 = false;
        if (v < iVar1) {
          pVar = Gia_ManCo(p->pGia,v);
          bVar9 = pVar != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        pGVar7 = Gia_ObjFanin0(pVar);
        *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff | 0x40000000;
        v = v + 1;
      }
      v = 0;
      while( true ) {
        bVar9 = false;
        if (v < p->pGia->nObjs) {
          pVar = Gia_ManObj(p->pGia,v);
          bVar9 = pVar != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        iVar1 = Gia_ObjIsAnd(pVar);
        if ((iVar1 != 0) && ((*(ulong *)pVar >> 0x1e & 1) != 0)) {
          pLits[0] = Abc_Var2Lit(pVar->Value,0);
          iVar1 = sat_solver_addclause(s,pLits,pLits + 1);
          if (iVar1 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                          ,0x62b,
                          "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
        }
        v = v + 1;
      }
      v = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->pGia->vCos);
        bVar9 = false;
        if (v < iVar1) {
          pVar = Gia_ManCo(p->pGia,v);
          bVar9 = pVar != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        pGVar7 = Gia_ObjFanin0(pVar);
        *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
        v = v + 1;
      }
      uVar4 = (s->stats).clauses;
      Vec_IntClear(p_00);
      iVar1 = Gia_ManAndNum(p->pGia);
      Vec_IntFillNatural(p_00,iVar1);
      iVar1 = Vec_IntSize(vBestNode);
      Cnf_AddCardinConstrPairWise(s,p_00,iVar1 + -2,0);
      printf("Problem clauses = %d.  Cardinality clauses = %d.\n",(ulong)uVar4,
             (ulong)((s->stats).clauses - uVar4));
      iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
      if (iVar1 == 0) {
        printf("Undecided.  ");
      }
      if (iVar1 == 1) {
        printf("Satisfiable.  ");
      }
      if (iVar1 == -1) {
        printf("Unsatisfiable. ");
      }
      aVar8 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar8 - aVar5);
      Sat_SolverPrintStats(_stdout,s);
      if (iVar1 == 1) {
        local_ac = 0;
        for (Var = 0; iVar1 = Gia_ManAndNum(p->pGia), Var < iVar1; Var = Var + 1) {
          uVar4 = sat_solver_var_value(s,Var);
          printf("%d",(ulong)uVar4);
          iVar1 = sat_solver_var_value(s,Var);
          local_ac = iVar1 + local_ac;
        }
        printf(" Nodes = %d\n",(ulong)local_ac);
        local_ac = 0;
        for (; iVar1 = Gia_ManAndNum(p->pGia), Var < iVar1 + nCutsAll; Var = Var + 1) {
          uVar4 = sat_solver_var_value(s,Var);
          printf("%d",(ulong)uVar4);
          iVar1 = sat_solver_var_value(s,Var);
          local_ac = iVar1 + local_ac;
        }
        printf(" LUTs = %d\n",(ulong)local_ac);
      }
      sat_solver_delete(s);
      Vec_IntFree(p_00);
      return;
    }
    iVar1 = Gia_ObjIsAnd(pVar);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(vFirst,v);
      iVar2 = Vec_IntEntry(vCutNum,v);
      Vec_IntClear(p_00);
      iVar3 = Abc_Var2Lit(pVar->Value,1);
      Vec_IntPush(p_00,iVar3);
      for (Lit = 0; Lit < iVar2; Lit = Lit + 1) {
        iVar3 = Abc_Var2Lit(iVar1 + Lit,0);
        Vec_IntPush(p_00,iVar3);
      }
      piVar6 = Vec_IntArray(p_00);
      end = Vec_IntLimit(p_00);
      iVar1 = sat_solver_addclause(s,piVar6,end);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                      ,0x606,
                      "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Of_ManCreateSat( Of_Man_t * p, int nCutsAll, Vec_Int_t * vFirst, Vec_Int_t * vCutNum, Vec_Int_t * vBestNode, Vec_Int_t * vBestCut )
{
    extern void Cnf_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict );

    Gia_Obj_t * pObj, * pVar;
    int * pCutSet, * pCut;
    int i, k, v, c, Var, Lit, pLits[2], status, RetValue, nCutCount, nClauses;
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    abctime clk = Abc_Clock();

    // start solver
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, Gia_ManAndNum(p->pGia) + nCutsAll );

    // set polarity
    Vec_IntAppend( vBestNode, vBestCut );
    //Vec_IntPrint( vBestNode );
    sat_solver_set_polarity( pSat, Vec_IntArray(vBestNode), Vec_IntSize(vBestNode) );
    Vec_IntShrink( vBestNode, Vec_IntSize(vBestNode) - Vec_IntSize(vBestCut) );

    // add clauses for nodes
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        int iFirst = Vec_IntEntry(vFirst, i);
        int nCuts = Vec_IntEntry(vCutNum, i);
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_Var2Lit(pObj->Value, 1) );
        for ( c = 0; c < nCuts; c++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iFirst + c, 0) );
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( RetValue );
    }

    // add clauses for cuts
    nCutCount = 0;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        pCutSet = Of_ObjCutSet(p, i);
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            pLits[0] = Abc_Var2Lit( Gia_ManAndNum(p->pGia) + nCutCount, 1 );
            pLits[1] = Abc_Var2Lit( pObj->Value, 0 );
            RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );
            assert( RetValue );
            Of_CutForEachVar( pCut, Var, v )
            {
                pVar = Gia_ManObj(p->pGia, Var);
                if ( !Gia_ObjIsAnd(pVar) )
                    continue;
                pLits[1] = Abc_Var2Lit( pVar->Value, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );
                assert( RetValue );
            }
            nCutCount++;
        }
    }
    assert( nCutCount == nCutsAll );

    // mark CO drivers
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    // set used nodes to 1
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( pObj->fMark0 )
        {
            Lit = Abc_Var2Lit( pObj->Value, 0 );
            RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
            assert( RetValue );
        }
    // unmark CO drivers
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 0;

//    Sat_SolverWriteDimacs( pSat, "temp.cnf", NULL, NULL, 0 );

    // add cardinality constraint
    nClauses = pSat->stats.clauses;
    Vec_IntClear( vLits );
    Vec_IntFillNatural( vLits, Gia_ManAndNum(p->pGia) );
    Cnf_AddCardinConstrPairWise( pSat, vLits, Vec_IntSize(vBestNode)-2, 0 );
    printf( "Problem clauses = %d.  Cardinality clauses = %d.\n", nClauses, pSat->stats.clauses - nClauses );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, 1000000, 0, 0, 0 );
    if ( status == l_Undef )
        printf( "Undecided.  " );
    if ( status == l_True )
        printf( "Satisfiable.  " );
    if ( status == l_False )
        printf( "Unsatisfiable. " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Sat_SolverPrintStats( stdout, pSat );
    if ( status == l_True )
    {
        int nOnes = 0;
        for ( v = 0; v < Gia_ManAndNum(p->pGia); v++ )
        {
            printf( "%d", sat_solver_var_value(pSat, v) );
            nOnes += sat_solver_var_value(pSat, v);
        }
        printf( " Nodes = %d\n", nOnes );

        nOnes = 0;
        for ( ; v < Gia_ManAndNum(p->pGia) + nCutsAll; v++ )
        {
            printf( "%d", sat_solver_var_value(pSat, v) );
            nOnes += sat_solver_var_value(pSat, v);
        }
        printf( " LUTs = %d\n", nOnes );
    }

    // cleanup
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
}